

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O2

error_t ArgumentHandlers::outputFileOptions_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  
  pvVar1 = state->input;
  if (key == 1) {
    *(char **)((long)pvVar1 + 0x58) = arg;
  }
  else if (key == 2) {
    *(undefined4 *)((long)pvVar1 + 0x60) = 1;
  }
  else if (key == 3) {
    *(undefined1 *)((long)pvVar1 + 100) = 1;
  }
  else if (key == 0x44) {
    *(char **)((long)pvVar1 + 0x50) = arg;
  }
  else {
    if (key != 100) {
      return 7;
    }
    *(undefined4 *)((long)pvVar1 + 0x48) = 1;
  }
  return 0;
}

Assistant:

error_t
outputFileOptions_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
        case 'd': 
            theArgumentsStruc->dryrun = 1;
            break;
        case 'D': 
            theArgumentsStruc->description = arg;
            break;
        case OPT_PREFIX:
            theArgumentsStruc->prefix = arg;
            break;
        case OPT_NORECOMPUTE:
            theArgumentsStruc->noReCompute = 1;
            break;
        case OPT_OUTPUT_POLICY:
            theArgumentsStruc->outputPolicy = true;
            break;
        default:
            return ARGP_ERR_UNKNOWN;
     }
    return 0;
}